

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O3

void __thiscall serial::Serial::SerialImpl::readUnlock(SerialImpl *this)

{
  IOException *this_00;
  int errnum;
  string local_48;
  
  errnum = pthread_mutex_unlock((pthread_mutex_t *)&this->read_mutex);
  if (errnum == 0) {
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x58);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/eyesight-tech[P]serial/src/impl/unix.cc"
             ,"");
  IOException::IOException(this_00,&local_48,0x42a,errnum);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void
Serial::SerialImpl::readUnlock ()
{
  int result = pthread_mutex_unlock(&this->read_mutex);
  if (result) {
    THROW (IOException, result);
  }
}